

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void __thiscall
wallet::wallet_tests::ListCoinsTestingSetup::~ListCoinsTestingSetup(ListCoinsTestingSetup *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::reset
            ((__uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             &this->wallet,(pointer)0x0);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::~unique_ptr
            (&this->wallet);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    TestChain100Setup::~TestChain100Setup(&this->super_TestChain100Setup);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~ListCoinsTestingSetup()
    {
        wallet.reset();
    }